

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

bool __thiscall QMakeEvaluator::loadSpec(QMakeEvaluator *this)

{
  QString *fileName;
  QString *fileName_00;
  QMakeGlobals *this_00;
  QMakeEvaluator *pQVar1;
  char16_t *pcVar2;
  ProFile *pPVar3;
  Data *pDVar4;
  qsizetype qVar5;
  Data *pDVar6;
  QString *pQVar7;
  Data *pDVar8;
  bool bVar9;
  VisitReturn VVar10;
  FileType FVar11;
  QList<ProString> *pQVar12;
  ProStringList *this_01;
  QString *pQVar13;
  char *str;
  QString *root;
  QArrayData *pQVar14;
  long lVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QAnyStringView QVar17;
  QMakeEvaluator evaluator;
  QArrayDataPointer<ProString> local_3a0;
  ProKey local_388;
  QArrayDataPointer<QString> local_358;
  QString local_338;
  undefined1 local_318 [16];
  QString *local_308;
  undefined1 local_2e8 [16];
  ProFile *local_2d8;
  QString QStack_1c0;
  QString aQStack_1a8 [15];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_338.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_338.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_338.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = this->m_option;
  pQVar13 = &this_00->xqmakespec;
  if (this->m_hostBuild != false) {
    pQVar13 = &this_00->qmakespec;
  }
  QMakeGlobals::expandEnvVars(&local_338,this_00,pQVar13);
  memset((QMakeEvaluator *)local_2e8,0xaa,0x2b0);
  QMakeEvaluator((QMakeEvaluator *)local_2e8,this->m_option,this->m_parser,this->m_vfs,
                 this->m_handler);
  QString::operator=(&QStack_1c0,(QString *)&this->m_sourceRoot);
  QString::operator=(aQStack_1a8,(QString *)&this->m_buildRoot);
  pQVar13 = &this->m_superfile;
  if ((this->m_superfile).d.size == 0) {
LAB_002842d4:
    fileName = &this->m_conffile;
    if ((this->m_conffile).d.size != 0) {
      VVar10 = evaluateFile((QMakeEvaluator *)local_2e8,fileName,EvalConfigFile,(LoadFlags)0x20);
      if (VVar10 != ReturnTrue) goto LAB_0028467e;
    }
    fileName_00 = &this->m_cachefile;
    if ((this->m_cachefile).d.size != 0) {
      VVar10 = evaluateFile((QMakeEvaluator *)local_2e8,fileName_00,EvalConfigFile,(LoadFlags)0x20);
      if (VVar10 != ReturnTrue) goto LAB_0028467e;
    }
    if ((undefined1 *)local_338.d.size == (undefined1 *)0x0) {
      if (this->m_hostBuild == false) {
        ProKey::ProKey(&local_388,"XQMAKESPEC");
        first((ProString *)local_318,(QMakeEvaluator *)local_2e8,&local_388);
        ProString::toQString((QString *)&local_358,(ProString *)local_318);
        pcVar2 = local_338.d.ptr;
        pDVar4 = local_338.d.d;
        qVar5 = local_358.size;
        pDVar6 = local_358.d;
        local_358.d = (Data *)local_338.d.d;
        local_338.d.d = (Data *)pDVar6;
        local_338.d.ptr = (char16_t *)local_358.ptr;
        local_358.ptr = (QString *)pcVar2;
        local_358.size = local_338.d.size;
        local_338.d.size = qVar5;
        if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_318._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
          }
        }
        if (&(local_388.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_388.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_388.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_388.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_388.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((undefined1 *)local_338.d.size != (undefined1 *)0x0) goto LAB_00284354;
      }
      ProKey::ProKey(&local_388,"QMAKESPEC");
      first((ProString *)local_318,(QMakeEvaluator *)local_2e8,&local_388);
      ProString::toQString((QString *)&local_358,(ProString *)local_318);
      pcVar2 = local_338.d.ptr;
      pDVar4 = local_338.d.d;
      qVar5 = local_358.size;
      pDVar6 = local_358.d;
      local_358.d = (Data *)local_338.d.d;
      local_338.d.d = (Data *)pDVar6;
      local_338.d.ptr = (char16_t *)local_358.ptr;
      local_358.ptr = (QString *)pcVar2;
      local_358.size = local_338.d.size;
      local_338.d.size = qVar5;
      if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_318._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
        }
      }
      if (&(local_388.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_388.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_388.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_388.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_388.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
    }
LAB_00284354:
    ProKey::ProKey((ProKey *)local_318,"QMAKEPATH");
    values((ProStringList *)&local_3a0,(QMakeEvaluator *)local_2e8,(ProKey *)local_318);
    ProStringList::toQStringList((QStringList *)&local_358,(ProStringList *)&local_3a0);
    qVar5 = local_358.size;
    pQVar7 = local_358.ptr;
    pDVar6 = local_358.d;
    local_358.size = 0;
    local_358.d = (Data *)0x0;
    local_358.ptr = (QString *)0x0;
    local_388.super_ProString.m_string.d.d = (Data *)(this->m_qmakepath).d.d;
    local_388.super_ProString.m_string.d.ptr = (char16_t *)(this->m_qmakepath).d.ptr;
    (this->m_qmakepath).d.d = pDVar6;
    (this->m_qmakepath).d.ptr = pQVar7;
    local_388.super_ProString.m_string.d.size = (this->m_qmakepath).d.size;
    (this->m_qmakepath).d.size = qVar5;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_388);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_358);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_3a0);
    if ((QArrayData *)local_318._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
      }
    }
    ProKey::ProKey((ProKey *)local_318,"QMAKEFEATURES");
    values((ProStringList *)&local_3a0,(QMakeEvaluator *)local_2e8,(ProKey *)local_318);
    ProStringList::toQStringList((QStringList *)&local_358,(ProStringList *)&local_3a0);
    qVar5 = local_358.size;
    pQVar7 = local_358.ptr;
    pDVar6 = local_358.d;
    local_358.size = 0;
    local_358.d = (Data *)0x0;
    local_358.ptr = (QString *)0x0;
    local_388.super_ProString.m_string.d.d = (Data *)(this->m_qmakefeatures).d.d;
    local_388.super_ProString.m_string.d.ptr = (char16_t *)(this->m_qmakefeatures).d.ptr;
    (this->m_qmakefeatures).d.d = pDVar6;
    (this->m_qmakefeatures).d.ptr = pQVar7;
    local_388.super_ProString.m_string.d.size = (this->m_qmakefeatures).d.size;
    (this->m_qmakefeatures).d.size = qVar5;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_388);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_358);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_3a0);
    if ((QArrayData *)local_318._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
      }
    }
    ~QMakeEvaluator((QMakeEvaluator *)local_2e8);
    updateMkspecPaths(this);
    if ((undefined1 *)local_338.d.size == (undefined1 *)0x0) {
      str = "QMAKE_XSPEC";
      if (this->m_hostBuild != false) {
        str = "QMAKE_SPEC";
      }
      ProKey::ProKey((ProKey *)local_318,str);
      propertyValue((ProString *)local_2e8,this,(ProKey *)local_318);
      ProString::toQString((QString *)&local_388,(ProString *)local_2e8);
      pcVar2 = local_338.d.ptr;
      pDVar8 = local_338.d.d;
      qVar5 = local_388.super_ProString.m_string.d.size;
      pDVar4 = local_388.super_ProString.m_string.d.d;
      local_388.super_ProString.m_string.d.d = local_338.d.d;
      local_338.d.d = pDVar4;
      local_338.d.ptr = local_388.super_ProString.m_string.d.ptr;
      local_388.super_ProString.m_string.d.ptr = pcVar2;
      local_388.super_ProString.m_string.d.size = local_338.d.size;
      local_338.d.size = qVar5;
      if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
        }
      }
      if ((QMakeEvaluator *)local_2e8._0_8_ != (QMakeEvaluator *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_318._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
        }
      }
    }
    bVar9 = QMakeInternal::IoUtils::isRelativePath(&local_338);
    if (bVar9) {
      lVar15 = (this->m_mkspecPaths).d.size;
      if (lVar15 != 0) {
        pQVar14 = (QArrayData *)(this->m_mkspecPaths).d.ptr;
        lVar15 = lVar15 * 0x18;
        do {
          local_2d8 = (ProFile *)&DAT_aaaaaaaaaaaaaaaa;
          local_2e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_2e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_318[8] = '/';
          local_318._0_8_ = pQVar14;
          local_308 = &local_338;
          QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_QString_&>::
          convertTo<QString>((QString *)local_2e8,
                             (QStringBuilder<QStringBuilder<const_QString_&,_QLatin1Char>,_QString_&>
                              *)local_318);
          FVar11 = QMakeInternal::IoUtils::fileType((QString *)local_2e8);
          if (FVar11 != FileNotFound) {
            QString::operator=(&local_338,(QString *)local_2e8);
          }
          if ((QMakeEvaluator *)local_2e8._0_8_ != (QMakeEvaluator *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
            }
          }
          if (FVar11 != FileNotFound) goto LAB_002846e1;
          pQVar14 = (QArrayData *)&pQVar14[1].alloc;
          lVar15 = lVar15 + -0x18;
        } while (lVar15 != 0);
      }
      QVar16.m_data = (storage_type *)0x1f;
      QVar16.m_size = (qsizetype)local_318;
      QString::fromLatin1(QVar16);
      QVar17.m_size = (size_t)local_318;
      QVar17.field_0.m_data = local_2e8;
      QString::arg_impl(QVar17,(int)local_338.d.ptr,(QChar)(char16_t)local_338.d.size);
      message(this,0x310,(QString *)local_2e8);
      if ((QMakeEvaluator *)local_2e8._0_8_ != (QMakeEvaluator *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_318._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
        }
      }
    }
    else {
LAB_002846e1:
      QDir::cleanPath((QString *)local_2e8);
      pQVar1 = (QMakeEvaluator *)(this->m_qmakespec).d.d;
      pcVar2 = (this->m_qmakespec).d.ptr;
      (this->m_qmakespec).d.d = (Data *)local_2e8._0_8_;
      (this->m_qmakespec).d.ptr = (char16_t *)local_2e8._8_8_;
      pPVar3 = (ProFile *)(this->m_qmakespec).d.size;
      (this->m_qmakespec).d.size = (qsizetype)local_2d8;
      local_2e8._0_8_ = pQVar1;
      local_2e8._8_8_ = pcVar2;
      local_2d8 = pPVar3;
      if (pQVar1 != (QMakeEvaluator *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&pQVar1->m_caller)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&pQVar1->m_caller)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&pQVar1->m_caller)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)pQVar1,2,0x10);
        }
      }
      if ((this->m_superfile).d.size != 0) {
        ProKey::ProKey((ProKey *)local_2e8,"_QMAKE_SUPER_CACHE_");
        pQVar12 = &valuesRef(this,(ProKey *)local_2e8)->super_QList<ProString>;
        ProString::ProString((ProString *)local_318,pQVar13);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_318);
        QList<ProString>::end(pQVar12);
        if ((QArrayData *)local_318._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
          }
        }
        if ((QMakeEvaluator *)local_2e8._0_8_ != (QMakeEvaluator *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
          }
        }
        VVar10 = evaluateFile(this,pQVar13,EvalConfigFile,(LoadFlags)0x20);
        if (VVar10 != ReturnTrue) goto LAB_0028468b;
      }
      bVar9 = loadSpecInternal(this);
      if (bVar9) {
        if ((this->m_conffile).d.size != 0) {
          ProKey::ProKey((ProKey *)local_2e8,"_QMAKE_CONF_");
          pQVar12 = &valuesRef(this,(ProKey *)local_2e8)->super_QList<ProString>;
          ProString::ProString((ProString *)local_318,fileName);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                    ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_318
                    );
          QList<ProString>::end(pQVar12);
          if ((QArrayData *)local_318._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
            }
          }
          if ((QMakeEvaluator *)local_2e8._0_8_ != (QMakeEvaluator *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
            }
          }
          bVar9 = false;
          VVar10 = evaluateFile(this,fileName,EvalConfigFile,(LoadFlags)0x0);
          if (VVar10 != ReturnTrue) goto LAB_0028468d;
        }
        if ((this->m_cachefile).d.size != 0) {
          ProKey::ProKey((ProKey *)local_2e8,"_QMAKE_CACHE_");
          pQVar12 = &valuesRef(this,(ProKey *)local_2e8)->super_QList<ProString>;
          ProString::ProString((ProString *)local_318,fileName_00);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                    ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_318
                    );
          QList<ProString>::end(pQVar12);
          if ((QArrayData *)local_318._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
            }
          }
          if ((QMakeEvaluator *)local_2e8._0_8_ != (QMakeEvaluator *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
            }
          }
          bVar9 = false;
          VVar10 = evaluateFile(this,fileName_00,EvalConfigFile,(LoadFlags)0x0);
          if (VVar10 != ReturnTrue) goto LAB_0028468d;
        }
        if ((this->m_stashfile).d.size != 0) {
          pQVar13 = &this->m_stashfile;
          bVar9 = QMakeVfs::exists(this->m_vfs,pQVar13,(VfsFlags)0x0);
          if (bVar9) {
            ProKey::ProKey((ProKey *)local_2e8,"_QMAKE_STASH_");
            this_01 = valuesRef(this,(ProKey *)local_2e8);
            ProString::ProString((ProString *)local_318,pQVar13);
            ProStringList::operator<<(this_01,(ProString *)local_318);
            if ((QArrayData *)local_318._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_318._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_318._0_8_,2,0x10);
              }
            }
            if ((QMakeEvaluator *)local_2e8._0_8_ != (QMakeEvaluator *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_2e8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_2e8._0_8_,2,0x10);
              }
            }
            bVar9 = false;
            VVar10 = evaluateFile(this,pQVar13,EvalConfigFile,(LoadFlags)0x0);
            if (VVar10 != ReturnTrue) goto LAB_0028468d;
          }
        }
        bVar9 = true;
        goto LAB_0028468d;
      }
    }
  }
  else {
    VVar10 = evaluateFile((QMakeEvaluator *)local_2e8,pQVar13,EvalConfigFile,(LoadFlags)0x20);
    if (VVar10 == ReturnTrue) goto LAB_002842d4;
LAB_0028467e:
    ~QMakeEvaluator((QMakeEvaluator *)local_2e8);
  }
LAB_0028468b:
  bVar9 = false;
LAB_0028468d:
  if (&(local_338.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_338.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_338.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeEvaluator::loadSpec()
{
    QString qmakespec = m_option->expandEnvVars(
                m_hostBuild ? m_option->qmakespec : m_option->xqmakespec);

    {
        QMakeEvaluator evaluator(m_option, m_parser, m_vfs, m_handler);
        evaluator.m_sourceRoot = m_sourceRoot;
        evaluator.m_buildRoot = m_buildRoot;

        if (!m_superfile.isEmpty() && evaluator.evaluateFile(
                m_superfile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue) {
            return false;
        }
        if (!m_conffile.isEmpty() && evaluator.evaluateFile(
                m_conffile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue) {
            return false;
        }
        if (!m_cachefile.isEmpty() && evaluator.evaluateFile(
                m_cachefile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue) {
            return false;
        }
        if (qmakespec.isEmpty()) {
            if (!m_hostBuild)
                qmakespec = evaluator.first(ProKey("XQMAKESPEC")).toQString();
            if (qmakespec.isEmpty())
                qmakespec = evaluator.first(ProKey("QMAKESPEC")).toQString();
        }
        m_qmakepath = evaluator.values(ProKey("QMAKEPATH")).toQStringList();
        m_qmakefeatures = evaluator.values(ProKey("QMAKEFEATURES")).toQStringList();
    }

    updateMkspecPaths();
    if (qmakespec.isEmpty())
        qmakespec = propertyValue(ProKey(m_hostBuild ? "QMAKE_SPEC" : "QMAKE_XSPEC")).toQString();
#ifndef QT_BUILD_QMAKE
    // Legacy support for Qt4 qmake in Qt Creator, etc.
    if (qmakespec.isEmpty())
        qmakespec = m_hostBuild ? QLatin1String("default-host") : QLatin1String("default");
#endif
    if (IoUtils::isRelativePath(qmakespec)) {
        for (const QString &root : std::as_const(m_mkspecPaths)) {
            QString mkspec = root + QLatin1Char('/') + qmakespec;
            if (IoUtils::exists(mkspec)) {
                qmakespec = mkspec;
                goto cool;
            }
        }
        evalError(fL1S("Could not find qmake spec '%1'.").arg(qmakespec));
        return false;
    }
  cool:
    m_qmakespec = QDir::cleanPath(qmakespec);

    if (!m_superfile.isEmpty()) {
        valuesRef(ProKey("_QMAKE_SUPER_CACHE_")) << ProString(m_superfile);
        if (evaluateFile(
                m_superfile, QMakeHandler::EvalConfigFile, LoadProOnly|LoadHidden) != ReturnTrue)
            return false;
    }
    if (!loadSpecInternal())
        return false;
    if (!m_conffile.isEmpty()) {
        valuesRef(ProKey("_QMAKE_CONF_")) << ProString(m_conffile);
        if (evaluateFile(
                m_conffile, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue)
            return false;
    }
    if (!m_cachefile.isEmpty()) {
        valuesRef(ProKey("_QMAKE_CACHE_")) << ProString(m_cachefile);
        if (evaluateFile(
                m_cachefile, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue)
            return false;
    }
    QMakeVfs::VfsFlags flags = (m_cumulative ? QMakeVfs::VfsCumulative : QMakeVfs::VfsExact);
    if (!m_stashfile.isEmpty() && m_vfs->exists(m_stashfile, flags)) {
        valuesRef(ProKey("_QMAKE_STASH_")) << ProString(m_stashfile);
        if (evaluateFile(
                m_stashfile, QMakeHandler::EvalConfigFile, LoadProOnly) != ReturnTrue)
            return false;
    }
    return true;
}